

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMBusAnalyzerResults.cpp
# Opt level: O2

void __thiscall
SMBusAnalyzerResults::GetBubbleText
          (SMBusAnalyzerResults *this,Frame *f,DisplayBase display_base,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *results)

{
  Frame FVar1;
  Frame *pFVar2;
  CommandDesc *pCVar3;
  ulong uVar4;
  char *__rhs;
  string *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  uint uVar7;
  char *pcVar8;
  ulong i;
  char *pcVar9;
  ulong i_00;
  char *__rhs_00;
  string val;
  string unit_on_off;
  string rw_s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  Frame *local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(results);
  switch(f[0x20]) {
  case (Frame)0x0:
    if (this->mSettings->mDecodeLevel != DL_Signals) goto LAB_0010e7e5;
    std::__cxx11::string::string((string *)&unit_on_off,"Start",(allocator *)&val);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &unit_on_off);
    break;
  case (Frame)0x1:
    if (this->mSettings->mDecodeLevel != DL_Signals) goto LAB_0010e7e5;
    std::__cxx11::string::string((string *)&unit_on_off,"Stop",(allocator *)&val);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &unit_on_off);
    break;
  case (Frame)0x2:
    std::__cxx11::string::string((string *)&unit_on_off,"0",(allocator *)&val);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &unit_on_off);
    break;
  case (Frame)0x3:
    std::__cxx11::string::string((string *)&unit_on_off,"1",(allocator *)&val);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &unit_on_off);
    break;
  case (Frame)0x4:
    std::__cxx11::string::string((string *)&unit_on_off,"ACK",(allocator *)&val);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &unit_on_off);
    break;
  case (Frame)0x5:
    std::__cxx11::string::string((string *)&unit_on_off,"NACK",(allocator *)&val);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &unit_on_off);
    break;
  case (Frame)0x6:
    int2str_sal_abi_cxx11_(&unit_on_off,*(U64 *)(f + 0x10),display_base,8);
    std::operator+(&rw_s,"Byte ",&unit_on_off);
    pcVar9 = " ACK";
    if (((byte)f[0x21] & 1) == 0) {
      pcVar9 = " NACK";
    }
    std::operator+(&val,&rw_s,pcVar9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)&rw_s);
    std::operator+(&rw_s,"Byte ",&unit_on_off);
    pcVar8 = " A";
    pcVar9 = " A";
    if (((byte)f[0x21] & 1) == 0) {
      pcVar9 = " N";
    }
    std::operator+(&val,&rw_s,pcVar9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)&rw_s);
    if (((byte)f[0x21] & 1) == 0) {
      pcVar8 = " N";
    }
    std::operator+(&val,&unit_on_off,pcVar8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    std::__cxx11::string::~string((string *)&val);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&unit_on_off);
    break;
  case (Frame)0x7:
    int2str_sal_abi_cxx11_(&unit_on_off,*(U64 *)(f + 0x10),display_base,0x10);
    std::operator+(&rw_s,"Word ",&unit_on_off);
    pcVar9 = " ACK";
    if (((byte)f[0x21] & 1) == 0) {
      pcVar9 = " NACK";
    }
    std::operator+(&val,&rw_s,pcVar9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)&rw_s);
    std::operator+(&rw_s,"Word ",&unit_on_off);
    pcVar8 = " A";
    pcVar9 = " A";
    if (((byte)f[0x21] & 1) == 0) {
      pcVar9 = " N";
    }
    std::operator+(&val,&rw_s,pcVar9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)&rw_s);
    if (((byte)f[0x21] & 1) == 0) {
      pcVar8 = " N";
    }
    std::operator+(&val,&unit_on_off,pcVar8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    std::__cxx11::string::~string((string *)&val);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&unit_on_off);
    break;
  case (Frame)0x8:
    int2str_sal_abi_cxx11_(&unit_on_off,*(U64 *)(f + 0x10),display_base,7);
    pcVar9 = "Read ";
    if (((byte)f[0x21] & 2) == 0) {
      pcVar9 = "Write ";
    }
    std::__cxx11::string::string((string *)&val,pcVar9,(allocator *)&rw_s);
    pcVar9 = "R ";
    if (((byte)f[0x21] & 2) == 0) {
      pcVar9 = "W ";
    }
    std::__cxx11::string::string((string *)&rw_s,pcVar9,(allocator *)&v);
    FVar1 = f[0x21];
    std::operator+(&local_158,&val,"address ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,
                   &local_158,&unit_on_off);
    pcVar9 = " ACK";
    if (((byte)FVar1 & 1) == 0) {
      pcVar9 = " NACK";
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,pcVar9)
    ;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v);
    std::__cxx11::string::~string((string *)&v);
    std::__cxx11::string::~string((string *)&v_1);
    std::__cxx11::string::~string((string *)&local_158);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&unit_on_off);
    pcVar8 = " A";
    if (((byte)FVar1 & 1) == 0) {
      pcVar8 = " N";
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   &unit_on_off,pcVar8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v);
    std::__cxx11::string::~string((string *)&v);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,&val,
                   &unit_on_off);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,pcVar8)
    ;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v);
    std::__cxx11::string::~string((string *)&v);
    std::__cxx11::string::~string((string *)&v_1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,&val,
                   &unit_on_off);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,pcVar9)
    ;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v);
    std::__cxx11::string::~string((string *)&v);
    std::__cxx11::string::~string((string *)&v_1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,&rw_s,
                   &unit_on_off);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,pcVar8)
    ;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v);
    std::__cxx11::string::~string((string *)&v);
    std::__cxx11::string::~string((string *)&v_1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,&rw_s,
                   &unit_on_off);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,pcVar9)
    ;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v);
    std::__cxx11::string::~string((string *)&v);
    std::__cxx11::string::~string((string *)&v_1);
    std::operator+(&local_158,&rw_s,"addr ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,
                   &local_158,&unit_on_off);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,pcVar8)
    ;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v);
    std::__cxx11::string::~string((string *)&v);
    std::__cxx11::string::~string((string *)&v_1);
    std::__cxx11::string::~string((string *)&local_158);
    std::operator+(&local_158,&rw_s,"address ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,
                   &local_158,&unit_on_off);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,pcVar9)
    ;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v);
    std::__cxx11::string::~string((string *)&v);
    std::__cxx11::string::~string((string *)&v_1);
    std::__cxx11::string::~string((string *)&local_158);
    std::operator+(&local_158,&val,"addr ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,
                   &local_158,&unit_on_off);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,pcVar8)
    ;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v);
    std::__cxx11::string::~string((string *)&v);
    std::__cxx11::string::~string((string *)&v_1);
    std::__cxx11::string::~string((string *)&local_158);
    psVar5 = &rw_s;
    goto LAB_0010e7ce;
  case (Frame)0x9:
    int2str_sal_abi_cxx11_(&unit_on_off,*(U64 *)(f + 0x10),display_base,8);
    int2str_sal_abi_cxx11_(&val,*(U64 *)(f + 0x18),display_base,8);
    if (*(long *)(f + 0x10) == *(long *)(f + 0x18)) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,"PEC ",
                     &unit_on_off);
      std::operator+(&rw_s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                     " OK");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&rw_s)
      ;
      std::__cxx11::string::~string((string *)&rw_s);
      std::__cxx11::string::~string((string *)&v);
      std::operator+(&rw_s,&unit_on_off," OK");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&rw_s)
      ;
      std::__cxx11::string::~string((string *)&rw_s);
      std::__cxx11::string::string((string *)&rw_s,"PEC OK",(allocator *)&v);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&rw_s)
      ;
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,
                     "Bad PEC ",&unit_on_off);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,
                     " should be ");
      std::operator+(&rw_s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                     &val);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&rw_s)
      ;
      std::__cxx11::string::~string((string *)&rw_s);
      std::__cxx11::string::~string((string *)&v);
      std::__cxx11::string::~string((string *)&v_1);
      std::operator+(&rw_s,&unit_on_off," bad PEC!");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&rw_s)
      ;
      std::__cxx11::string::~string((string *)&rw_s);
      std::__cxx11::string::string((string *)&rw_s,"Bad PEC!",(allocator *)&v);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&rw_s)
      ;
    }
    std::__cxx11::string::~string((string *)&rw_s);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&unit_on_off);
    goto LAB_0010e7d3;
  case (Frame)0xa:
    int2str_sal_abi_cxx11_(&unit_on_off,*(U64 *)(f + 0x10),display_base,8);
    std::operator+(&val,"Command ",&unit_on_off);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    std::__cxx11::string::~string((string *)&val);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&unit_on_off);
    std::operator+(&val,"Cmd ",&unit_on_off);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    goto LAB_0010e7d3;
  case (Frame)0xb:
    pCVar3 = GetPMBusCommandDesc(*(U64 *)(f + 0x10));
    goto LAB_0010c901;
  case (Frame)0xc:
    pCVar3 = GetSmartBatteryCommandDesc(*(U64 *)(f + 0x10));
LAB_0010c901:
    pcVar9 = pCVar3->name;
    int2str_sal_abi_cxx11_(&unit_on_off,*(U64 *)(f + 0x10),display_base,8);
    std::__cxx11::string::string((string *)&v_1,pcVar9,(allocator *)&local_158);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   "Command ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1);
    std::operator+(&rw_s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v," "
                  );
    std::operator+(&val,&rw_s,&unit_on_off);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)&rw_s);
    std::__cxx11::string::~string((string *)&v);
    std::__cxx11::string::~string((string *)&v_1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&unit_on_off);
    std::__cxx11::string::string((string *)&val,pcVar9,(allocator *)&rw_s);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::string((string *)&rw_s,pcVar9,(allocator *)&v);
    std::operator+(&val,"Cmd ",&rw_s);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)&rw_s);
    std::operator+(&val,"Cmd ",&unit_on_off);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::string((string *)&v_1,pcVar9,(allocator *)&local_158);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,"Cmd ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1);
    std::operator+(&rw_s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v," "
                  );
    std::operator+(&val,&rw_s,&unit_on_off);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)&rw_s);
    std::__cxx11::string::~string((string *)&v);
    std::__cxx11::string::~string((string *)&v_1);
    std::__cxx11::string::string((string *)&rw_s,pcVar9,(allocator *)&v);
    std::operator+(&val,"Command ",&rw_s);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)&rw_s);
    std::operator+(&val,"Command ",&unit_on_off);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    goto LAB_0010e7d3;
  case (Frame)0xd:
    int2str_sal_abi_cxx11_(&unit_on_off,*(U64 *)(f + 0x10),display_base,7);
    std::operator+(&val,"Byte count ",&unit_on_off);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    std::__cxx11::string::~string((string *)&val);
    std::operator+(&val,"ByteCount ",&unit_on_off);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    std::__cxx11::string::~string((string *)&val);
    std::operator+(&val,"Cnt ",&unit_on_off);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    std::__cxx11::string::~string((string *)&val);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&unit_on_off);
    break;
  case (Frame)0xe:
    uVar4 = *(ulong *)(f + 0x10);
    local_118 = (Frame *)0x113350;
    if (-1 < (char)uVar4) {
      local_118 = (Frame *)0x113362;
    }
    pcVar9 = "Reserved, ";
    if (((uint)uVar4 & 0x60) == 0x20) {
      pcVar9 = "Max bus speed 400KHz, ";
    }
    pcVar8 = "Max bus speed 100KHz, ";
    if ((uVar4 & 0x60) != 0) {
      pcVar8 = pcVar9;
    }
    pcVar9 = "SMBALERT supported ";
    if ((uVar4 & 0x10) == 0) {
      pcVar9 = "SMBALERT unsupported ";
    }
    int2str_sal_abi_cxx11_(&unit_on_off,uVar4,display_base,8);
    std::operator+(&local_158,"Capability data byte ",&unit_on_off);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,
                   &local_158," ");
    pFVar2 = local_118;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,
                   (char *)local_118);
    std::operator+(&rw_s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   pcVar8);
    std::operator+(&val,&rw_s,pcVar9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)&rw_s);
    std::__cxx11::string::~string((string *)&v);
    std::__cxx11::string::~string((string *)&v_1);
    std::__cxx11::string::~string((string *)&local_158);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&unit_on_off);
    std::operator+(&rw_s,"Capability ",&unit_on_off);
    std::operator+(&val,&rw_s," ...");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)&rw_s);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,
                   "Capability ",&unit_on_off);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1," ");
    std::operator+(&rw_s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   (char *)pFVar2);
    std::operator+(&val,&rw_s,"...");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)&rw_s);
    std::__cxx11::string::~string((string *)&v);
    std::__cxx11::string::~string((string *)&v_1);
    std::operator+(&local_158,"Capability ",&unit_on_off);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,
                   &local_158," ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,
                   (char *)pFVar2);
    std::operator+(&rw_s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   pcVar8);
    std::operator+(&val,&rw_s,"...");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)&rw_s);
    std::__cxx11::string::~string((string *)&v);
    std::__cxx11::string::~string((string *)&v_1);
    pbVar6 = &local_158;
    goto LAB_0010e7d6;
  case (Frame)0xf:
    uVar4 = *(ulong *)(f + 0x10);
    if ((char)uVar4 < '\0') {
      pcVar9 = "for write";
      if ((uVar4 & 0x40) == 0) {
        pcVar9 = "";
      }
      std::__cxx11::string::string((string *)&unit_on_off,pcVar9,(allocator *)&val);
      pcVar9 = "for read";
      if ((uVar4 & 0x20) == 0) {
        pcVar9 = "";
      }
      uVar7 = (uint)(uVar4 >> 2) & 7;
      if (uVar7 == 7) {
        pcVar8 = "error format";
      }
      else {
        pcVar8 = &DAT_0011321c + *(int *)(&DAT_0011321c + (ulong)uVar7 * 4);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                     "Command supported ",&unit_on_off);
      std::operator+(&rw_s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                     pcVar9);
      std::operator+(&val,&rw_s,pcVar8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
      std::__cxx11::string::~string((string *)&val);
      std::__cxx11::string::~string((string *)&rw_s);
      std::__cxx11::string::~string((string *)&v);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                     "Command supported ",&unit_on_off);
      std::operator+(&rw_s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                     pcVar9);
      std::operator+(&val,&rw_s,"...");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
      std::__cxx11::string::~string((string *)&val);
      std::__cxx11::string::~string((string *)&rw_s);
      std::__cxx11::string::~string((string *)&v);
      std::operator+(&rw_s,"Command supported ",&unit_on_off);
      std::operator+(&val,&rw_s,"...");
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
      std::__cxx11::string::~string((string *)&val);
      std::__cxx11::string::~string((string *)&rw_s);
      std::__cxx11::string::string((string *)&val,"Command supported...",(allocator *)&rw_s);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
      std::__cxx11::string::~string((string *)&val);
      std::__cxx11::string::string((string *)&val,"Supported...",(allocator *)&rw_s);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
      goto LAB_0010e7d3;
    }
    std::__cxx11::string::string((string *)&unit_on_off,"Command unsupported",(allocator *)&val);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &unit_on_off);
    std::__cxx11::string::~string((string *)&unit_on_off);
    std::__cxx11::string::string((string *)&unit_on_off,"unsupported",(allocator *)&val);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &unit_on_off);
    break;
  case (Frame)0x10:
    switch(*(ulong *)(f + 0x10) << 0x3b | *(ulong *)(f + 0x10) >> 5) {
    case 0:
      std::__cxx11::string::string
                ((string *)&unit_on_off,"Enable writes to all commands",(allocator *)&val);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &unit_on_off);
      std::__cxx11::string::~string((string *)&unit_on_off);
      std::__cxx11::string::string((string *)&unit_on_off,"Enable...",(allocator *)&val);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &unit_on_off);
      std::__cxx11::string::~string((string *)&unit_on_off);
      std::__cxx11::string::string((string *)&unit_on_off,"Enable all writes...",(allocator *)&val);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &unit_on_off);
      break;
    case 1:
      std::__cxx11::string::string
                ((string *)&unit_on_off,
                 "Disable all writes except to the WRITE_PROTECT, OPERATION, PAGE, ON_OFF_CONFIG and VOUT_COMMAND commands"
                 ,(allocator *)&val);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &unit_on_off);
      std::__cxx11::string::~string((string *)&unit_on_off);
      std::__cxx11::string::string((string *)&unit_on_off,"Disable...",(allocator *)&val);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &unit_on_off);
      std::__cxx11::string::~string((string *)&unit_on_off);
      std::__cxx11::string::string
                ((string *)&unit_on_off,
                 "Disable all except WRITE_PROTECT, OPERATION, PAGE, ON_OFF_CONFIG and VOUT_COMMAND..."
                 ,(allocator *)&val);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &unit_on_off);
      break;
    case 2:
      std::__cxx11::string::string
                ((string *)&unit_on_off,
                 "Disable all writes except to the WRITE_PROTECT, OPERATION and PAGE commands",
                 (allocator *)&val);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &unit_on_off);
      std::__cxx11::string::~string((string *)&unit_on_off);
      std::__cxx11::string::string((string *)&unit_on_off,"Disable...",(allocator *)&val);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &unit_on_off);
      std::__cxx11::string::~string((string *)&unit_on_off);
      std::__cxx11::string::string
                ((string *)&unit_on_off,"Disable all except WRITE_PROTECT, OPERATION and PAGE...",
                 (allocator *)&val);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &unit_on_off);
      break;
    default:
      std::__cxx11::string::string((string *)&unit_on_off,"Invalid Data!",(allocator *)&val);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &unit_on_off);
      std::__cxx11::string::~string((string *)&unit_on_off);
      std::__cxx11::string::string((string *)&unit_on_off,"Invalid",(allocator *)&val);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &unit_on_off);
      break;
    case 4:
      std::__cxx11::string::string
                ((string *)&unit_on_off,"Disable all writes except to the WRITE_PROTECT command",
                 (allocator *)&val);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &unit_on_off);
      std::__cxx11::string::~string((string *)&unit_on_off);
      std::__cxx11::string::string((string *)&unit_on_off,"Disable...",(allocator *)&val);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &unit_on_off);
      std::__cxx11::string::~string((string *)&unit_on_off);
      std::__cxx11::string::string
                ((string *)&unit_on_off,"Disable all except WRITE_PROTECT...",(allocator *)&val);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
                 &unit_on_off);
    }
    break;
  case (Frame)0x11:
    pcVar9 = "<invalid>";
    std::__cxx11::string::string((string *)&unit_on_off,"<invalid>",(allocator *)&val);
    switch(*(uint *)(f + 0x10) >> 6 & 3) {
    case 0:
      goto LAB_0010e670;
    case 1:
LAB_0010e670:
      std::__cxx11::string::assign((char *)&unit_on_off);
      pcVar9 = "N/A";
      break;
    case 2:
      std::__cxx11::string::assign((char *)&unit_on_off);
      uVar4 = (ulong)((uint)*(undefined8 *)(f + 0x10) & 0x3c);
      if (uVar4 - 0x14 < 0x18) {
        pcVar9 = &DAT_00113238 + *(int *)(&DAT_00113224 + uVar4);
      }
    }
    int2str_sal_abi_cxx11_(&val,*(U64 *)(f + 0x10),display_base,8);
    std::operator+(&local_138,"Operation params ",&val);
    std::operator+(&local_158,&local_138," Unit on/off=");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,
                   &local_158,&unit_on_off);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,
                   ", Margin state=");
    std::operator+(&rw_s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   pcVar9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&rw_s);
    std::__cxx11::string::~string((string *)&rw_s);
    std::__cxx11::string::~string((string *)&v);
    std::__cxx11::string::~string((string *)&v_1);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_138);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&val);
    std::__cxx11::string::string((string *)&rw_s,"Operation params...",(allocator *)&v);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&rw_s);
    std::__cxx11::string::~string((string *)&rw_s);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   &unit_on_off,", ");
    std::operator+(&rw_s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   pcVar9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&rw_s);
    std::__cxx11::string::~string((string *)&rw_s);
    psVar5 = (string *)&v;
LAB_0010e7ce:
    std::__cxx11::string::~string((string *)psVar5);
    goto LAB_0010e7d3;
  case (Frame)0x12:
    int2str_sal_abi_cxx11_(&unit_on_off,*(U64 *)(f + 0x10),display_base,8);
    uVar4 = *(ulong *)(f + 0x10);
    pcVar9 = "CONTROL pin and OPERATION command";
    if ((uVar4 & 0x10) == 0) {
      pcVar9 = "Any time";
    }
    pcVar8 = "Acknowledge on/off portion of OPERATION command";
    if ((uVar4 & 8) == 0) {
      pcVar8 = "Ignore on/off portion of OPERATION command";
    }
    __rhs_00 = "CONTROL is active high";
    if ((uVar4 & 2) == 0) {
      __rhs_00 = "CONTROL is active low";
    }
    __rhs = "Turn off the output as fast as possible";
    if ((uVar4 & 1) == 0) {
      __rhs = "Use programmed turn off delay";
    }
    local_118 = f;
    std::operator+(&local_d0,"Params ",&unit_on_off);
    std::operator+(&local_f0,&local_d0,": ");
    std::operator+(&local_110,&local_f0,pcVar9);
    f = local_118;
    std::operator+(&local_138,&local_110,", ");
    std::operator+(&local_158,&local_138,pcVar8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,
                   &local_158,", ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,
                   __rhs_00);
    std::operator+(&rw_s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   ", ");
    std::operator+(&val,&rw_s,__rhs);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)&rw_s);
    std::__cxx11::string::~string((string *)&v);
    std::__cxx11::string::~string((string *)&v_1);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&unit_on_off);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,"Params "
                   ,&unit_on_off);
    std::operator+(&rw_s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   ": ");
    std::operator+(&val,&rw_s,pcVar9);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)&rw_s);
    std::__cxx11::string::~string((string *)&v);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,
                   "Params ",&unit_on_off);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,": ");
    std::operator+(&rw_s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   pcVar9);
    std::operator+(&val,&rw_s,"...");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)&rw_s);
    std::__cxx11::string::~string((string *)&v);
    std::__cxx11::string::~string((string *)&v_1);
    std::operator+(&local_138,"Params ",&unit_on_off);
    std::operator+(&local_158,&local_138,": ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,
                   &local_158,pcVar9);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,", ");
    std::operator+(&rw_s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   pcVar8);
    std::operator+(&val,&rw_s,"...");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)&rw_s);
    std::__cxx11::string::~string((string *)&v);
    std::__cxx11::string::~string((string *)&v_1);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_138);
    std::operator+(&local_f0,"Params ",&unit_on_off);
    std::operator+(&local_110,&local_f0,": ");
    std::operator+(&local_138,&local_110,pcVar9);
    std::operator+(&local_158,&local_138,", ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,
                   &local_158,pcVar8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,", ");
    std::operator+(&rw_s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   __rhs_00);
    std::operator+(&val,&rw_s,"...");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)&rw_s);
    std::__cxx11::string::~string((string *)&v);
    std::__cxx11::string::~string((string *)&v_1);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_110);
    pbVar6 = &local_f0;
    goto LAB_0010e7d6;
  case (Frame)0x13:
    int2str_sal_abi_cxx11_(&unit_on_off,*(U64 *)(f + 0x10),display_base,8);
    uVar4 = *(ulong *)(f + 0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,
                   &unit_on_off," Mode: ");
    int2str_sal_abi_cxx11_(&local_158,uVar4 >> 5 & 0xff,display_base,3);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,
                   &local_158);
    std::operator+(&rw_s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   " Param: ");
    int2str_sal_abi_cxx11_(&local_138,(ulong)((uint)uVar4 & 0x1f),display_base,5);
    std::operator+(&val,&rw_s,&local_138);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&rw_s);
    std::__cxx11::string::~string((string *)&v);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&v_1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&unit_on_off);
    break;
  case (Frame)0x14:
    int2str_sal_abi_cxx11_(&unit_on_off,*(U64 *)(f + 0x10),display_base,0x10);
    std::operator+(&rw_s,"BatteryMode ",&unit_on_off);
    std::operator+(&val,&rw_s," ");
    std::__cxx11::string::~string((string *)&rw_s);
    v.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    v.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    v.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    BitFieldToDescAll(BatteryModeBits,*(U64 *)(f + 0x10),&v);
    psVar5 = &rw_s;
    std::__cxx11::string::string((string *)psVar5,"",(allocator *)&v_1);
    AddResultStringsFromVector((SMBusAnalyzerResults *)psVar5,&val,&v,&rw_s,results);
    std::__cxx11::string::~string((string *)&rw_s);
    std::__cxx11::string::swap
              ((string *)
               (results->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&unit_on_off);
    this_00 = &v;
    goto LAB_0010d00c;
  case (Frame)0x15:
    int2str_sal_abi_cxx11_(&unit_on_off,*(U64 *)(f + 0x10),display_base,0x10);
    std::operator+(&rw_s,"BatteryStatus ",&unit_on_off);
    std::operator+(&val,&rw_s," ");
    std::__cxx11::string::~string((string *)&rw_s);
    v_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    v_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    v_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    BitFieldToDescAll(BatteryStatusBits,*(U64 *)(f + 0x10),&v_1);
    std::__cxx11::string::string
              ((string *)&v,ErrorCodesDesc[*(uint *)(f + 0x10) & 7],(allocator *)&local_158);
    pbVar6 = &rw_s;
    std::operator+(pbVar6,"ErrorCode=",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v);
    AddResultStringsFromVector((SMBusAnalyzerResults *)pbVar6,&val,&v_1,&rw_s,results);
    std::__cxx11::string::~string((string *)&rw_s);
    std::__cxx11::string::~string((string *)&v);
    std::__cxx11::string::swap
              ((string *)
               (results->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&unit_on_off);
    this_00 = &v_1;
LAB_0010d00c:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this_00);
    goto LAB_0010e7d3;
  case (Frame)0x16:
    int2str_sal_abi_cxx11_(&unit_on_off,*(U64 *)(f + 0x10),display_base,0x10);
    uVar4 = *(ulong *)(f + 0x10);
    std::operator+(&local_d0,"SpecificationInfo ",&unit_on_off);
    std::operator+(&local_f0,&local_d0," Revision=");
    local_118 = (Frame *)(ulong)((uint)uVar4 & 0xf);
    int2str_sal_abi_cxx11_(&local_90,(U64)local_118,display_base,4);
    std::operator+(&local_110,&local_f0,&local_90);
    std::operator+(&local_138,&local_110," Version=");
    i = (ulong)((uint)(uVar4 >> 4) & 0xf);
    int2str_sal_abi_cxx11_(&local_b0,i,display_base,4);
    std::operator+(&local_158,&local_138,&local_b0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,
                   &local_158," VScale=");
    i_00 = (ulong)((uint)(uVar4 >> 8) & 0xf);
    int2str_sal_abi_cxx11_(&local_50,i_00,display_base,4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,
                   &local_50);
    std::operator+(&rw_s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   " IPScale=");
    int2str_sal_abi_cxx11_(&local_70,uVar4 >> 0xc & 0xff,display_base,4);
    std::operator+(&val,&rw_s,&local_70);
    pFVar2 = local_118;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&rw_s);
    std::__cxx11::string::~string((string *)&v);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&v_1);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,
                   "SpecificationInfo ",&unit_on_off);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,
                   " Revision=");
    int2str_sal_abi_cxx11_(&local_158,(U64)pFVar2,display_base,4);
    std::operator+(&rw_s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   &local_158);
    std::operator+(&val,&rw_s,", ...");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)&rw_s);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&v);
    std::__cxx11::string::~string((string *)&v_1);
    std::operator+(&local_138,"SpecificationInfo ",&unit_on_off);
    std::operator+(&local_158,&local_138," Revision=");
    int2str_sal_abi_cxx11_(&local_110,(U64)pFVar2,display_base,4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,
                   &local_158,&local_110);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,
                   " Version=");
    int2str_sal_abi_cxx11_(&local_f0,i,display_base,4);
    std::operator+(&rw_s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   &local_f0);
    std::operator+(&val,&rw_s,", ...");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)&rw_s);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&v);
    std::__cxx11::string::~string((string *)&v_1);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_138);
    std::operator+(&local_f0,"SpecificationInfo ",&unit_on_off);
    std::operator+(&local_110,&local_f0," Revision=");
    int2str_sal_abi_cxx11_(&local_d0,(U64)pFVar2,display_base,4);
    std::operator+(&local_138,&local_110,&local_d0);
    std::operator+(&local_158,&local_138," Version=");
    int2str_sal_abi_cxx11_(&local_90,i,display_base,4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,
                   &local_158,&local_90);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,
                   " VScale=");
    int2str_sal_abi_cxx11_(&local_b0,i_00,display_base,4);
    std::operator+(&rw_s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   &local_b0);
    std::operator+(&val,&rw_s,", ...");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    std::__cxx11::string::~string((string *)&val);
    std::__cxx11::string::~string((string *)&rw_s);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&v);
    std::__cxx11::string::~string((string *)&v_1);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&unit_on_off);
    std::operator+(&rw_s,"SpecificationInfo ",&unit_on_off);
    std::operator+(&val,&rw_s," ...");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&val);
    std::__cxx11::string::~string((string *)&val);
    pbVar6 = &rw_s;
    goto LAB_0010e7d6;
  case (Frame)0x17:
    int2str_sal_abi_cxx11_(&unit_on_off,*(U64 *)(f + 0x10),display_base,0x10);
    uVar4 = *(ulong *)(f + 0x10);
    int2str_abi_cxx11_(&local_158,(ulong)((uint)(uVar4 >> 5) & 0xf));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,
                   &local_158,"/");
    int2str_abi_cxx11_(&local_138,(ulong)((uint)uVar4 & 0x1f));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,
                   &local_138);
    std::operator+(&rw_s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,"/"
                  );
    int2str_abi_cxx11_(&local_110,(ulong)((uint)(uVar4 >> 9) & 0x9f) + 0x7bc);
    std::operator+(&val,&rw_s,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&rw_s);
    std::__cxx11::string::~string((string *)&v);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&v_1);
    std::__cxx11::string::~string((string *)&local_158);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1,
                   "ManufactureDate ",&unit_on_off);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v_1," ");
    std::operator+(&rw_s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   &val);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&rw_s);
    std::__cxx11::string::~string((string *)&rw_s);
    std::__cxx11::string::~string((string *)&v);
    std::__cxx11::string::~string((string *)&v_1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   "ManufactureDate ",&unit_on_off);
    std::operator+(&rw_s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v,
                   " ...");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,&rw_s);
    std::__cxx11::string::~string((string *)&rw_s);
    std::__cxx11::string::~string((string *)&v);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(results,&unit_on_off);
LAB_0010e7d3:
    pbVar6 = &val;
LAB_0010e7d6:
    std::__cxx11::string::~string((string *)pbVar6);
    break;
  default:
    std::__cxx11::string::string((string *)&unit_on_off,".",(allocator *)&val);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)results,
               &unit_on_off);
  }
  std::__cxx11::string::~string((string *)&unit_on_off);
LAB_0010e7e5:
  if ((*(undefined8 **)(f + 0x18) != (undefined8 *)0x0) && (f[0x20] != (Frame)0x9)) {
    std::__cxx11::string::string
              ((string *)&val,(char *)**(undefined8 **)(f + 0x18),(allocator *)&rw_s);
    std::operator+(&unit_on_off," Protocol=",&val);
    std::__cxx11::string::append
              ((string *)
               (results->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::~string((string *)&unit_on_off);
    std::__cxx11::string::~string((string *)&val);
  }
  return;
}

Assistant:

void SMBusAnalyzerResults::GetBubbleText( const Frame& f, DisplayBase display_base, std::vector<std::string>& results )
{
    results.clear();

    if( f.mType == SMB_Start )
    {
        if( mSettings->mDecodeLevel == DL_Signals )
            results.push_back( "Start" );
    }
    else if( f.mType == SMB_Stop )
    {
        if( mSettings->mDecodeLevel == DL_Signals )
            results.push_back( "Stop" );
    }
    else if( f.mType == SMB_Zero )
        results.push_back( "0" );
    else if( f.mType == SMB_One )
        results.push_back( "1" );
    else if( f.mType == SMB_ACK )
        results.push_back( "ACK" );
    else if( f.mType == SMB_NACK )
        results.push_back( "NACK" );
    else if( f.mType == FT_Byte )
    {
        std::string num( int2str_sal( f.mData1, display_base, 8 ) );
        results.push_back( "Byte " + num + ( ( f.mFlags & F_IsAcked ) ? " ACK" : " NACK" ) );
        results.push_back( "Byte " + num + ( ( f.mFlags & F_IsAcked ) ? " A" : " N" ) );
        results.push_back( num + ( ( f.mFlags & F_IsAcked ) ? " A" : " N" ) );
        results.push_back( num );
    }
    else if( f.mType == FT_Word )
    {
        std::string num( int2str_sal( f.mData1, display_base, 16 ) );

        results.push_back( "Word " + num + ( ( f.mFlags & F_IsAcked ) ? " ACK" : " NACK" ) );
        results.push_back( "Word " + num + ( ( f.mFlags & F_IsAcked ) ? " A" : " N" ) );
        results.push_back( num + ( ( f.mFlags & F_IsAcked ) ? " A" : " N" ) );
        results.push_back( num );
    }
    else if( f.mType == FT_PEC )
    {
        std::string readPEC( int2str_sal( f.mData1, display_base, 8 ) );
        std::string calcedPEC( int2str_sal( f.mData2, display_base, 8 ) );

        if( f.mData1 == f.mData2 )
        {
            results.push_back( "PEC " + readPEC + " OK" );
            results.push_back( readPEC + " OK" );
            results.push_back( "PEC OK" );
        }
        else
        {
            results.push_back( "Bad PEC " + readPEC + " should be " + calcedPEC );
            results.push_back( readPEC + " bad PEC!" );
            results.push_back( "Bad PEC!" );
        }

        results.push_back( readPEC );
    }
    else if( f.mType == FT_Address )
    {
        std::string addr( int2str_sal( f.mData1, display_base, 7 ) );
        std::string rw = ( f.mFlags & F_IsRead ) ? "Read " : "Write ";
        std::string rw_s = ( f.mFlags & F_IsRead ) ? "R " : "W ";
        const bool is_acked = f.mFlags & F_IsAcked;

        results.push_back( rw + "address " + addr + ( is_acked ? " ACK" : " NACK" ) );
        results.push_back( addr );
        results.push_back( addr + ( is_acked ? " A" : " N" ) );
        results.push_back( rw + addr + ( is_acked ? " A" : " N" ) );
        results.push_back( rw + addr + ( is_acked ? " ACK" : " NACK" ) );
        results.push_back( rw_s + addr + ( is_acked ? " A" : " N" ) );
        results.push_back( rw_s + addr + ( is_acked ? " ACK" : " NACK" ) );
        results.push_back( rw_s + "addr " + addr + ( is_acked ? " A" : " N" ) );
        results.push_back( rw_s + "address " + addr + ( is_acked ? " ACK" : " NACK" ) );
        results.push_back( rw + "addr " + addr + ( is_acked ? " A" : " N" ) );
    }
    else if( f.mType == FT_ByteCount )
    {
        std::string bc_str( int2str_sal( f.mData1, display_base, 7 ) );

        results.push_back( "Byte count " + bc_str );
        results.push_back( "ByteCount " + bc_str );
        results.push_back( "Cnt " + bc_str );
        results.push_back( bc_str );
    }
    else if( f.mType == FT_CmdPMBus || f.mType == FT_CmdSmartBattery )
    {
        CommandDesc cmd;
        if( f.mType == FT_CmdPMBus )
            cmd = GetPMBusCommandDesc( f.mData1 );
        else
            cmd = GetSmartBatteryCommandDesc( f.mData1 );

        std::string id( int2str_sal( f.mData1, display_base, 8 ) );

        results.push_back( "Command " + std::string( cmd.name ) + " " + id );
        results.push_back( id );
        results.push_back( cmd.name );
        results.push_back( "Cmd " + std::string( cmd.name ) );
        results.push_back( "Cmd " + id );
        results.push_back( "Cmd " + std::string( cmd.name ) + " " + id );
        results.push_back( "Command " + std::string( cmd.name ) );
        results.push_back( "Command " + id );
    }
    else if( f.mType == FT_CmdSMBus )
    {
        std::string id( int2str_sal( f.mData1, display_base, 8 ) );

        results.push_back( "Command " + id );
        results.push_back( id );
        results.push_back( "Cmd " + id );
    }
    else if( f.mType == FT_PMBusCapability )
    {
        U8 bm = ( U8 )f.mData1;
        const char* pec_desc = ( f.mData1 & 0x80 ? "PEC unsupported, " : "PEC supported, " );

        const char* max_bus_speed;
        switch( f.mData1 & 0x60 )
        {
        case 0x00:
            max_bus_speed = "Max bus speed 100KHz, ";
            break;
        case 0x20:
            max_bus_speed = "Max bus speed 400KHz, ";
            break;
        default:
            max_bus_speed = "Reserved, ";
            break;
        }

        const char* smbalert_desc = ( ( f.mData1 & 0x10 ) ? "SMBALERT supported " : "SMBALERT unsupported " );

        std::string val_str( int2str_sal( f.mData1, display_base, 8 ) );

        results.push_back( "Capability data byte " + val_str + " " + pec_desc + max_bus_speed + smbalert_desc );
        results.push_back( val_str );
        results.push_back( "Capability " + val_str + " ..." );
        results.push_back( "Capability " + val_str + " " + pec_desc + "..." );
        results.push_back( "Capability " + val_str + " " + pec_desc + max_bus_speed + "..." );
    }
    else if( f.mType == FT_PMBusQuery )
    {
        U8 bm = ( U8 )f.mData1;

        // command supported?
        if( bm & 0x80 )
        {
            std::string for_write = ( bm & 0x40 ) ? "for write" : "";
            const char* for_read = ( bm & 0x20 ) ? "for read" : "";
            const char* format;
            switch( bm & 0x1C )
            {
            case 0x00:
                format = "Linear data format";
                break;
            case 0x0C:
                format = "Direct mode format";
                break;
            case 0x14:
                format = "VID mode format";
                break;
            case 0x18:
                format = "Manufacturer specific format";
                break;
            default:
                format = "error format";
                break;
            }

            results.push_back( "Command supported " + for_write + for_read + format );
            results.push_back( "Command supported " + for_write + for_read + "..." );
            results.push_back( "Command supported " + for_write + "..." );
            results.push_back( "Command supported..." );
            results.push_back( "Supported..." );
        }
        else
        {
            results.push_back( "Command unsupported" );
            results.push_back( "unsupported" );
        }
    }
    else if( f.mType == FT_PMBusWriteProtect )
    {
        switch( f.mData1 )
        {
        case 0x80:
            results.push_back( "Disable all writes except to the WRITE_PROTECT command" );
            results.push_back( "Disable..." );
            results.push_back( "Disable all except WRITE_PROTECT..." );
            break;
        case 0x40:
            results.push_back( "Disable all writes except to the WRITE_PROTECT, OPERATION and PAGE commands" );
            results.push_back( "Disable..." );
            results.push_back( "Disable all except WRITE_PROTECT, OPERATION and PAGE..." );
            break;
        case 0x20:
            results.push_back( "Disable all writes except to the WRITE_PROTECT, OPERATION, PAGE, ON_OFF_CONFIG and VOUT_COMMAND commands" );
            results.push_back( "Disable..." );
            results.push_back( "Disable all except WRITE_PROTECT, OPERATION, PAGE, ON_OFF_CONFIG and VOUT_COMMAND..." );
            break;
        case 0x00:
            results.push_back( "Enable writes to all commands" );
            results.push_back( "Enable..." );
            results.push_back( "Enable all writes..." );
            break;
        default:
            results.push_back( "Invalid Data!" );
            results.push_back( "Invalid" );
            break;
        }
    }
    else if( f.mType == FT_PMBusOperation )
    {
        std::string unit_on_off = "<invalid>";
        const char* margin_state = "<invalid>";
        switch( f.mData1 & 0xC0 )
        {
        case 0x00:
            unit_on_off = "Immediate off (no sequencing)";
            margin_state = "N/A";
            break;
        case 0x40:
            unit_on_off = "Soft off (with sequencing)";
            margin_state = "N/A";
            break;
        case 0x80:
            unit_on_off = "Unit on";
            switch( f.mData1 & 0x3C )
            {
            case 0x14:
                margin_state = "Margin low (ignore fault)";
                break;
            case 0x18:
                margin_state = "Margin low (act on fault)";
                break;
            case 0x24:
                margin_state = "Margin high (ignore fault)";
                break;
            case 0x28:
                margin_state = "Margin high (act on fault)";
                break;
            }
            break;
        }

        std::string val( int2str_sal( f.mData1, display_base, 8 ) );

        results.push_back( "Operation params " + val + " Unit on/off=" + unit_on_off + ", Margin state=" + margin_state );
        results.push_back( val );
        results.push_back( "Operation params..." );
        results.push_back( unit_on_off + ", " + margin_state );
    }
    else if( f.mType == FT_PMBusOnOffConfig )
    {
        std::string val( int2str_sal( f.mData1, display_base, 8 ) );

        const char* power_up = ( f.mData1 & 0x10 ) ? "CONTROL pin and OPERATION command" : "Any time";
        const char* commands =
            ( f.mData1 & 0x08 ) ? "Acknowledge on/off portion of OPERATION command" : "Ignore on/off portion of OPERATION command";
        const char* control = ( f.mData1 & 0x04 ) ? "CONTROL pin required to operate" : "Ignore CONTROL pin";
        const char* polarity = ( f.mData1 & 0x02 ) ? "CONTROL is active high" : "CONTROL is active low";
        const char* action = ( f.mData1 & 0x01 ) ? "Turn off the output as fast as possible" : "Use programmed turn off delay";

        results.push_back( "Params " + val + ": " + power_up + ", " + commands + ", " + polarity + ", " + action );
        results.push_back( val );
        results.push_back( "Params " + val + ": " + power_up );
        results.push_back( "Params " + val + ": " + power_up + "..." );
        results.push_back( "Params " + val + ": " + power_up + ", " + commands + "..." );
        results.push_back( "Params " + val + ": " + power_up + ", " + commands + ", " + polarity + "..." );
    }
    else if( f.mType == FT_PMBusVoutMode )
    {
        std::string val( int2str_sal( f.mData1, display_base, 8 ) );

        U8 mode = U8( f.mData1 >> 5 );
        U8 param = U8( f.mData1 & 0x1F );

        results.push_back( val + " Mode: " + int2str_sal( mode, display_base, 3 ) + " Param: " + int2str_sal( param, display_base, 5 ) );
        results.push_back( val );
    }
    else if( f.mType == FT_SmartBattBatteryMode )
    {
        std::string val( int2str_sal( f.mData1, display_base, 16 ) );
        std::string prefix( "BatteryMode " + val + " " );

        std::vector<std::string> v;
        BitFieldToDescAll( BatteryModeBits, f.mData1, v );

        AddResultStringsFromVector( prefix, v, "", results );

        // make sure the longest description is the first in the vector
        std::swap( results.front(), results.back() );

        results.push_back( val );
    }
    else if( f.mType == FT_SmartBattBatteryStatus )
    {
        std::string val( int2str_sal( f.mData1, display_base, 16 ) );
        std::string prefix( "BatteryStatus " + val + " " );

        std::vector<std::string> v;
        BitFieldToDescAll( BatteryStatusBits, f.mData1, v );

        AddResultStringsFromVector( prefix, v, "ErrorCode=" + std::string( ErrorCodesDesc[ f.mData1 & 0x07 ] ), results );

        // make sure the longest description is the first in the vector
        std::swap( results.front(), results.back() );

        results.push_back( val );
    }
    else if( f.mType == FT_SmartBattSpecificationInfo )
    {
        std::string val( int2str_sal( f.mData1, display_base, 16 ) );

        U8 revision = f.mData1 & 0x0f;
        U8 version = ( f.mData1 >> 4 ) & 0x0f;
        U8 vscale = ( f.mData1 >> 8 ) & 0x0f;
        U8 ipscale = U8( f.mData1 >> 12 );

        results.push_back( "SpecificationInfo " + val + " Revision=" + int2str_sal( revision, display_base, 4 ) +
                           " Version=" + int2str_sal( version, display_base, 4 ) + " VScale=" + int2str_sal( vscale, display_base, 4 ) +
                           " IPScale=" + int2str_sal( ipscale, display_base, 4 ) );

        results.push_back( "SpecificationInfo " + val + " Revision=" + int2str_sal( revision, display_base, 4 ) + ", ..." );

        results.push_back( "SpecificationInfo " + val + " Revision=" + int2str_sal( revision, display_base, 4 ) +
                           " Version=" + int2str_sal( version, display_base, 4 ) + ", ..." );

        results.push_back( "SpecificationInfo " + val + " Revision=" + int2str_sal( revision, display_base, 4 ) + " Version=" +
                           int2str_sal( version, display_base, 4 ) + " VScale=" + int2str_sal( vscale, display_base, 4 ) + ", ..." );

        results.push_back( val );
        results.push_back( "SpecificationInfo " + val + " ..." );
    }
    else if( f.mType == FT_SmartBattManufactureDate )
    {
        std::string val( int2str_sal( f.mData1, display_base, 16 ) );

        U8 day = f.mData1 & 0x1f;            // 5 bits
        U8 month = ( f.mData1 >> 5 ) & 0x0f; // 4 bits
        U16 year = ( f.mData1 >> 9 ) & 0x9f; // 7 bits
        year += 1980;

        std::string date( int2str( month ) + "/" + int2str( day ) + "/" + int2str( year ) );

        results.push_back( "ManufactureDate " + val + " " + date );
        results.push_back( "ManufactureDate " + val + " ..." );
        results.push_back( val );
    }
    else
    {
        results.push_back( "." );
    }

    // add the protocol name
    if( f.mData2 != 0 && f.mType != FT_PEC )
    {
        const SMBusProtocol* pProt = ( const SMBusProtocol* )f.mData2;
        results.front() += " Protocol=" + std::string( pProt->name );
    }
}